

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O1

CommandOptions * write_JP2K_S_file(CommandOptions *Options)

{
  MajorMode_t MVar1;
  AESEncContext *this;
  HMACContext *this_00;
  long lVar2;
  CommandOptions *in_RSI;
  MyInfo *pMVar3;
  size_type **ppsVar4;
  uint uVar5;
  byte bVar6;
  SequenceParser ParserLeft;
  MXFSWriter Writer;
  FortunaRNG RNG;
  SequenceParser ParserRight;
  WriterInfo Info;
  FrameBuffer FrameBuffer;
  byte_t IV_buf [16];
  PictureDescriptor PDesc;
  allocator<char> local_421;
  AESEncContext *local_420;
  SequenceParser local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [48];
  size_type *local_3c8 [2];
  size_type local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3b0;
  size_type local_398;
  undefined1 auStack_390 [9];
  bool bStack_387;
  _Alloc_hider local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  long *local_360 [2];
  long local_350 [2];
  long *local_340 [2];
  long local_330 [2];
  LabelSet_t local_320;
  long *local_318 [2];
  long local_308 [11];
  undefined1 local_2b0 [64];
  undefined1 local_270 [104];
  PictureDescriptor local_208;
  
  bVar6 = 0;
  ASDCP::JP2K::MXFSWriter::MXFSWriter((MXFSWriter *)local_408);
  ASDCP::JP2K::FrameBuffer::FrameBuffer((FrameBuffer *)local_2b0,in_RSI->fb_size);
  local_208.EditRate.Numerator = 0;
  local_208.EditRate.Denominator = 0;
  local_208.SampleRate.Numerator = 0;
  local_208.SampleRate.Denominator = 0;
  local_208.AspectRatio.Numerator = 0;
  local_208.AspectRatio.Denominator = 0;
  ASDCP::JP2K::SequenceParser::SequenceParser(local_418);
  ASDCP::JP2K::SequenceParser::SequenceParser((SequenceParser *)(local_3f8 + 0x20));
  if (in_RSI->file_count == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3c8,in_RSI->filenames[0],(allocator<char> *)local_318);
    ASDCP::JP2K::SequenceParser::OpenRead((string *)Options,SUB81(local_418,0));
    if (local_3c8[0] != &local_3b8) {
      operator_delete(local_3c8[0],local_3b8 + 1);
    }
    if (-1 < (int)Options->mode) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_318,in_RSI->filenames[1],(allocator<char> *)local_3f8);
      ASDCP::JP2K::SequenceParser::OpenRead((string *)local_3c8,(bool)((char)local_3f8 + ' '));
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_3c8);
      Kumu::Result_t::~Result_t((Result_t *)local_3c8);
      if (local_318[0] != local_308) {
        operator_delete(local_318[0],local_308[0] + 1);
      }
    }
    if (-1 < (int)Options->mode) {
      ASDCP::JP2K::SequenceParser::FillPictureDescriptor((PictureDescriptor *)local_270);
      Kumu::Result_t::~Result_t((Result_t *)local_270);
      local_208.EditRate = CommandOptions::PictureRate(in_RSI);
      if (in_RSI->verbose_flag == true) {
        fputs("JPEG 2000 stereoscopic pictures\nPictureDescriptor:\n",_stderr);
        fprintf(_stderr,"Frame Buffer size: %u\n",(ulong)in_RSI->fb_size);
        ASDCP::JP2K::PictureDescriptorDump(&local_208,(_IO_FILE *)0x0);
      }
    }
    if (((int)Options->mode < 0) || (in_RSI->no_write_flag != false)) {
      local_420 = (AESEncContext *)0x0;
    }
    else {
      pMVar3 = &s_MyInfo;
      ppsVar4 = local_3c8;
      for (lVar2 = 8; lVar2 != 0; lVar2 = lVar2 + -1) {
        *ppsVar4 = *(size_type **)(pMVar3->super_WriterInfo).ProductUUID;
        pMVar3 = (MyInfo *)((long)pMVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        ppsVar4 = ppsVar4 + (ulong)bVar6 * -2 + 1;
      }
      auStack_390[8] = s_MyInfo.super_WriterInfo.EncryptedEssence;
      bStack_387 = s_MyInfo.super_WriterInfo.UsesHMAC;
      local_380._M_p = (pointer)&local_370;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_380,s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p,
                 s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p +
                 s_MyInfo.super_WriterInfo.ProductVersion._M_string_length);
      local_360[0] = local_350;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_360,s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p,
                 s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p +
                 s_MyInfo.super_WriterInfo.CompanyName._M_string_length);
      local_340[0] = local_330;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_340,s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p,
                 s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p +
                 s_MyInfo.super_WriterInfo.ProductName._M_string_length);
      local_320 = s_MyInfo.super_WriterInfo.LabelSetType;
      if (in_RSI->asset_id_flag == true) {
        local_3b8 = *(size_type *)in_RSI->asset_id_value;
        aStack_3b0._M_allocated_capacity = *(undefined8 *)(in_RSI->asset_id_value + 8);
      }
      else {
        Kumu::GenRandomUUID((uchar *)&local_3b8);
      }
      if (in_RSI->use_smpte_labels == true) {
        write_JP2K_S_file();
      }
      if (in_RSI->key_flag == true) {
        Kumu::FortunaRNG::FortunaRNG((FortunaRNG *)local_3f8);
        Kumu::GenRandomUUID((uchar *)(aStack_3b0._M_local_buf + 8));
        auStack_390[8] = true;
        if (in_RSI->key_id_flag == true) {
          local_398 = *(size_type *)in_RSI->key_id_value;
          auStack_390._0_8_ = *(undefined8 *)(in_RSI->key_id_value + 8);
        }
        else {
          Kumu::FortunaRNG::FillRandom(local_3f8,(uint)&local_398);
        }
        this = (AESEncContext *)operator_new(8);
        ASDCP::AESEncContext::AESEncContext(this);
        local_420 = this;
        ASDCP::AESEncContext::InitKey((uchar *)local_318);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_318);
        Kumu::Result_t::~Result_t((Result_t *)local_318);
        if (-1 < (int)Options->mode) {
          Kumu::FortunaRNG::FillRandom(local_3f8,(int)local_2b0 + 0x28);
          ASDCP::AESEncContext::SetIVec((uchar *)local_318);
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_318);
          Kumu::Result_t::~Result_t((Result_t *)local_318);
        }
        if ((-1 < (int)Options->mode) && (in_RSI->write_hmac == true)) {
          bStack_387 = true;
          this_00 = (HMACContext *)operator_new(8);
          ASDCP::HMACContext::HMACContext(this_00);
          ASDCP::HMACContext::InitKey((uchar *)local_318,(LabelSet_t)this_00);
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_318);
          Kumu::Result_t::~Result_t((Result_t *)local_318);
        }
        Kumu::FortunaRNG::~FortunaRNG((FortunaRNG *)local_3f8);
      }
      else {
        local_420 = (AESEncContext *)0x0;
      }
      if (-1 < (int)Options->mode) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3f8,in_RSI->out_file,&local_421);
        ASDCP::JP2K::MXFSWriter::OpenWrite
                  ((string *)local_318,(WriterInfo *)local_408,(PictureDescriptor *)local_3f8,
                   (uint)local_3c8);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_318);
        Kumu::Result_t::~Result_t((Result_t *)local_318);
        if (local_3f8._0_8_ != (long)local_3f8 + 0x10) {
          operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
        }
      }
      if (local_340[0] != local_330) {
        operator_delete(local_340[0],local_330[0] + 1);
      }
      if (local_360[0] != local_350) {
        operator_delete(local_360[0],local_350[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_p != &local_370) {
        operator_delete(local_380._M_p,local_370._M_allocated_capacity + 1);
      }
    }
    if (-1 < (int)Options->mode) {
      ASDCP::JP2K::SequenceParser::Reset();
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_3c8);
      Kumu::Result_t::~Result_t((Result_t *)local_3c8);
      if (-1 < (int)Options->mode) {
        ASDCP::JP2K::SequenceParser::Reset();
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_3c8);
        Kumu::Result_t::~Result_t((Result_t *)local_3c8);
      }
      MVar1 = Options->mode;
      if ((-1 < (int)MVar1) && (in_RSI->duration != 0)) {
        uVar5 = 0;
        do {
          ASDCP::JP2K::SequenceParser::ReadFrame((FrameBuffer *)local_3c8);
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_3c8);
          Kumu::Result_t::~Result_t((Result_t *)local_3c8);
          if (-1 < (int)Options->mode) {
            if (in_RSI->verbose_flag == true) {
              ASDCP::JP2K::FrameBuffer::Dump((_IO_FILE *)local_2b0,(uint)_stderr);
            }
            if (in_RSI->encrypt_header_flag == true) {
              local_2b0._36_4_ = 0;
            }
          }
          if ((-1 < (int)Options->mode) && (in_RSI->no_write_flag == false)) {
            ASDCP::JP2K::MXFSWriter::WriteFrame
                      ((FrameBuffer *)local_3c8,(StereoscopicPhase_t)local_408,
                       (AESEncContext *)local_2b0,(HMACContext *)0x0);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_3c8);
            Kumu::Result_t::~Result_t((Result_t *)local_3c8);
          }
          if (-1 < (int)Options->mode) {
            ASDCP::JP2K::SequenceParser::ReadFrame((FrameBuffer *)local_3c8);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_3c8);
            Kumu::Result_t::~Result_t((Result_t *)local_3c8);
          }
          if (-1 < (int)Options->mode) {
            if (in_RSI->verbose_flag == true) {
              ASDCP::JP2K::FrameBuffer::Dump((_IO_FILE *)local_2b0,(uint)_stderr);
            }
            if (in_RSI->encrypt_header_flag == true) {
              local_2b0._36_4_ = 0;
            }
          }
          if ((-1 < (int)Options->mode) && (in_RSI->no_write_flag == false)) {
            ASDCP::JP2K::MXFSWriter::WriteFrame
                      ((FrameBuffer *)local_3c8,(StereoscopicPhase_t)local_408,
                       (AESEncContext *)local_2b0,(HMACContext *)0x1);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_3c8);
            Kumu::Result_t::~Result_t((Result_t *)local_3c8);
          }
          MVar1 = Options->mode;
        } while ((-1 < (int)MVar1) && (uVar5 = uVar5 + 1, uVar5 < in_RSI->duration));
      }
      if (MVar1 == Kumu::RESULT_ENDOFFILE) {
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)Kumu::RESULT_OK);
      }
    }
    if ((-1 < (int)Options->mode) && (in_RSI->no_write_flag == false)) {
      ASDCP::JP2K::MXFSWriter::Finalize();
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_3c8);
      Kumu::Result_t::~Result_t((Result_t *)local_3c8);
    }
  }
  else {
    fwrite("Two inputs are required for stereoscopic option.\n",0x31,1,_stderr);
    Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Kumu::RESULT_FAIL);
  }
  ASDCP::JP2K::SequenceParser::~SequenceParser((SequenceParser *)(local_3f8 + 0x20));
  ASDCP::JP2K::SequenceParser::~SequenceParser(local_418);
  ASDCP::FrameBuffer::~FrameBuffer((FrameBuffer *)local_2b0);
  ASDCP::JP2K::MXFSWriter::~MXFSWriter((MXFSWriter *)local_408);
  return Options;
}

Assistant:

Result_t
write_JP2K_S_file(CommandOptions& Options)
{
  AESEncContext*          Context = 0;
  HMACContext*            HMAC = 0;
  JP2K::MXFSWriter        Writer;
  JP2K::FrameBuffer       FrameBuffer(Options.fb_size);
  JP2K::PictureDescriptor PDesc;
  JP2K::SequenceParser    ParserLeft, ParserRight;
  byte_t                  IV_buf[CBC_BLOCK_SIZE];

  if ( Options.file_count != 2 )
    {
      fprintf(stderr, "Two inputs are required for stereoscopic option.\n");
      return RESULT_FAIL;
    }

  // set up essence parser
  Result_t result = ParserLeft.OpenRead(Options.filenames[0], Options.j2c_pedantic);

  if ( ASDCP_SUCCESS(result) )
    result = ParserRight.OpenRead(Options.filenames[1], Options.j2c_pedantic);

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {
      ParserLeft.FillPictureDescriptor(PDesc);
      PDesc.EditRate = Options.PictureRate();

      if ( Options.verbose_flag )
	{
	  fputs("JPEG 2000 stereoscopic pictures\nPictureDescriptor:\n", stderr);
          fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	  JP2K::PictureDescriptorDump(PDesc);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    {
      WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
      if ( Options.asset_id_flag )
	memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
      else
	Kumu::GenRandomUUID(Info.AssetUUID);

      if ( Options.use_smpte_labels )
	{
	  Info.LabelSetType = LS_MXF_SMPTE;
	  fprintf(stderr, "ATTENTION! Writing SMPTE Universal Labels\n");
	}

#ifdef HAVE_OPENSSL
      // configure encryption
      if( Options.key_flag )
	{
          Kumu::FortunaRNG RNG;

	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	  else
	    RNG.FillRandom(Info.CryptographicKeyID, UUIDlen);

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
	    {
	      Info.UsesHMAC = true;
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	}
#endif // HAVE_OPENSSL

      if ( ASDCP_SUCCESS(result) )
	result = Writer.OpenWrite(Options.out_file, Info, PDesc);
    }

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t duration = 0;
      result = ParserLeft.Reset();
      if ( ASDCP_SUCCESS(result) ) result = ParserRight.Reset();

      while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
	  result = ParserLeft.ReadFrame(FrameBuffer);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);
		  
	      if ( Options.encrypt_header_flag )
		FrameBuffer.PlaintextOffset(0);
	    }

	  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
	    result = Writer.WriteFrame(FrameBuffer, JP2K::SP_LEFT, Context, HMAC);

	  if ( ASDCP_SUCCESS(result) )
	    result = ParserRight.ReadFrame(FrameBuffer);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);
		  
	      if ( Options.encrypt_header_flag )
		FrameBuffer.PlaintextOffset(0);
	    }

	  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
	    result = Writer.WriteFrame(FrameBuffer, JP2K::SP_RIGHT, Context, HMAC);
	}

      if ( result == RESULT_ENDOFFILE )
	result = RESULT_OK;
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}